

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

int png_set_option(png_structrp png_ptr,int option,int onoff)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = (byte)option;
  uVar2 = 1;
  if ((option & 1U) == 0 && ((uint)option < 0xc && png_ptr != (png_structrp)0x0)) {
    uVar2 = png_ptr->options;
    png_ptr->options = ~(3 << (bVar1 & 0x1f)) & uVar2 | 3 - (uint)(onoff == 0) << (bVar1 & 0x1f);
    uVar2 = uVar2 >> (bVar1 & 0x1f) & 3;
  }
  return uVar2;
}

Assistant:

int PNGAPI
png_set_option(png_structrp png_ptr, int option, int onoff)
{
   if (png_ptr != NULL && option >= 0 && option < PNG_OPTION_NEXT &&
      (option & 1) == 0)
   {
      png_uint_32 mask = 3U << option;
      png_uint_32 setting = (2U + (onoff != 0)) << option;
      png_uint_32 current = png_ptr->options;

      png_ptr->options = (png_uint_32)((current & ~mask) | setting);

      return (int)(current & mask) >> option;
   }

   return PNG_OPTION_INVALID;
}